

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  int *piVar1;
  ImGuiTabBar *pIVar2;
  char *pcVar3;
  ImGuiTabItem *pIVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (0 < (this->Map).Data.Size) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      lVar5 = (long)*(int *)((long)&((this->Map).Data.Data)->key + lVar6);
      if (lVar5 != -1) {
        pIVar2 = (this->Buf).Data;
        pcVar3 = pIVar2[lVar5].TabsNames.Buf.Data;
        if (pcVar3 != (char *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
        }
        pIVar4 = pIVar2[lVar5].Tabs.Data;
        if (pIVar4 != (ImGuiTabItem *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (this->Map).Data.Size);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar2 = (this->Buf).Data;
  if (pIVar2 != (ImGuiTabBar *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiTabBar *)0x0;
  }
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }